

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

drmp3_uint64
drmp3_read_src(drmp3_src *pSRC,drmp3_uint64 frameCount,void *pFramesOut,void *pUserData)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  drmp3_uint32 dVar4;
  drmp3_uint64 dVar5;
  uint uVar6;
  ulong uVar7;
  float fVar8;
  
  if (frameCount == 0) {
    dVar5 = 0;
  }
  else {
    dVar5 = 0;
    do {
      for (; iVar1 = *(int *)((long)pUserData + 0x1a4c), iVar1 != 0 && frameCount != 0;
          frameCount = frameCount - 1) {
        iVar2 = *(int *)((long)pUserData + 0x1a20);
        uVar3 = *(uint *)((long)pUserData + 0x1a48);
        if (*(int *)((long)pUserData + 0x1a40) == 1) {
          fVar8 = (float)(int)*(short *)((long)pUserData + (ulong)uVar3 * 2 + 0x1a50) *
                  3.0517578e-05;
          *(float *)pFramesOut = fVar8;
          if (iVar2 != 1) {
LAB_001072b3:
            *(float *)((long)pFramesOut + 4) = fVar8;
          }
        }
        else {
          uVar6 = *(int *)((long)pUserData + 0x1a40) * uVar3;
          uVar7 = (ulong)(uVar6 + 1);
          fVar8 = (float)(int)*(short *)((long)pUserData + (ulong)uVar6 * 2 + 0x1a50) *
                  3.0517578e-05;
          if (iVar2 != 1) {
            *(float *)pFramesOut = fVar8;
            fVar8 = (float)(int)*(short *)((long)pUserData + uVar7 * 2 + 0x1a50) * 3.0517578e-05;
            goto LAB_001072b3;
          }
          *(float *)pFramesOut =
               ((float)(int)*(short *)((long)pUserData + uVar7 * 2 + 0x1a50) * 3.0517578e-05 +
               fVar8 + 0.0) * 0.5;
        }
        *(uint *)((long)pUserData + 0x1a48) = uVar3 + 1;
        *(int *)((long)pUserData + 0x1a4c) = iVar1 + -1;
        dVar5 = dVar5 + 1;
        pFramesOut = (void *)((long)pFramesOut + (ulong)(pSRC->config).channels * 4);
      }
    } while ((frameCount != 0) && (dVar4 = drmp3_decode_next_frame((drmp3 *)pUserData), dVar4 != 0))
    ;
  }
  return dVar5;
}

Assistant:

static drmp3_uint64 drmp3_read_src(drmp3_src* pSRC, drmp3_uint64 frameCount, void* pFramesOut, void* pUserData)
{
    drmp3* pMP3 = (drmp3*)pUserData;
            drmp3_assert(pMP3 != NULL);
            drmp3_assert(pMP3->onRead != NULL);

    float* pFramesOutF = (float*)pFramesOut;
    drmp3_uint64 totalFramesRead = 0;

    while (frameCount > 0) {
        // Read from the in-memory buffer first.
        while (pMP3->pcmFramesRemainingInMP3Frame > 0 && frameCount > 0) {
            drmp3d_sample_t* frames = (drmp3d_sample_t*)pMP3->pcmFrames;
#ifndef DR_MP3_FLOAT_OUTPUT
            if (pMP3->mp3FrameChannels == 1) {
                if (pMP3->channels == 1) {
                    // Mono -> Mono.
                    pFramesOutF[0] = frames[pMP3->pcmFramesConsumedInMP3Frame] / 32768.0f;
                } else {
                    // Mono -> Stereo.
                    pFramesOutF[0] = frames[pMP3->pcmFramesConsumedInMP3Frame] / 32768.0f;
                    pFramesOutF[1] = frames[pMP3->pcmFramesConsumedInMP3Frame] / 32768.0f;
                }
            } else {
                if (pMP3->channels == 1) {
                    // Stereo -> Mono
                    float sample = 0;
                    sample += frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+0] / 32768.0f;
                    sample += frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+1] / 32768.0f;
                    pFramesOutF[0] = sample * 0.5f;
                } else {
                    // Stereo -> Stereo
                    pFramesOutF[0] = frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+0] / 32768.0f;
                    pFramesOutF[1] = frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+1] / 32768.0f;
                }
            }
#else
            if (pMP3->mp3FrameChannels == 1) {
                if (pMP3->channels == 1) {
                    // Mono -> Mono.
                    pFramesOutF[0] = frames[pMP3->pcmFramesConsumedInMP3Frame];
                } else {
                    // Mono -> Stereo.
                    pFramesOutF[0] = frames[pMP3->pcmFramesConsumedInMP3Frame];
                    pFramesOutF[1] = frames[pMP3->pcmFramesConsumedInMP3Frame];
                }
            } else {
                if (pMP3->channels == 1) {
                    // Stereo -> Mono
                    float sample = 0;
                    sample += frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+0];
                    sample += frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+1];
                    pFramesOutF[0] = sample * 0.5f;
                } else {
                    // Stereo -> Stereo
                    pFramesOutF[0] = frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+0];
                    pFramesOutF[1] = frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+1];
                }
            }
#endif

            pMP3->pcmFramesConsumedInMP3Frame += 1;
            pMP3->pcmFramesRemainingInMP3Frame -= 1;
            totalFramesRead += 1;
            frameCount -= 1;
            pFramesOutF += pSRC->config.channels;
        }

        if (frameCount == 0) {
            break;
        }

                drmp3_assert(pMP3->pcmFramesRemainingInMP3Frame == 0);

        // At this point we have exhausted our in-memory buffer so we need to re-fill. Note that the sample rate may have changed
        // at this point which means we'll also need to update our sample rate conversion pipeline.
        if (drmp3_decode_next_frame(pMP3) == 0) {
            break;
        }
    }

    return totalFramesRead;
}